

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t archive_read_format_tar_read_header(archive_read *a,archive_entry *entry)

{
  tar *tar;
  wchar_t wVar1;
  mode_t mVar2;
  wchar_t wVar3;
  archive_string_conv *paVar4;
  wchar_t *__s;
  size_t sVar5;
  char *__s_00;
  long lVar6;
  sparse_block *sb;
  sparse_block *psVar7;
  size_t local_38;
  
  local_38 = 0;
  archive_entry_set_dev(entry,(long)archive_read_format_tar_read_header::default_dev + 1);
  lVar6 = (long)archive_read_format_tar_read_header::default_inode;
  archive_read_format_tar_read_header::default_inode = (wchar_t)(lVar6 + 1);
  archive_entry_set_ino(entry,lVar6 + 1);
  if (L'\xfffe' < archive_read_format_tar_read_header::default_inode) {
    archive_read_format_tar_read_header::default_dev =
         archive_read_format_tar_read_header::default_dev + L'\x01';
    archive_read_format_tar_read_header::default_inode = L'\0';
  }
  tar = (tar *)a->format->data;
  tar->entry_offset = 0;
  while (psVar7 = tar->sparse_list, psVar7 != (sparse_block *)0x0) {
    tar->sparse_list = psVar7->next;
    free(psVar7);
  }
  tar->sparse_last = (sparse_block *)0x0;
  tar->realsize = -1;
  tar->sconv = tar->opt_sconv;
  if (tar->opt_sconv == (archive_string_conv *)0x0) {
    if (tar->init_default_conversion == 0) {
      paVar4 = archive_string_default_conversion_for_read(&a->archive);
      tar->sconv_default = paVar4;
      tar->init_default_conversion = 1;
    }
    else {
      paVar4 = tar->sconv_default;
    }
    tar->sconv = paVar4;
  }
  wVar1 = tar_read_header(a,tar,entry,&local_38);
  if (local_38 != 0) {
    __archive_read_consume(a,local_38);
  }
  psVar7 = tar->sparse_list;
  if (psVar7 == (sparse_block *)0x0) {
    wVar3 = gnu_add_sparse_entry(a,tar,0,tar->entry_bytes_remaining);
    if (wVar3 != L'\0') {
      return L'\xffffffe2';
    }
  }
  else {
    do {
      if (psVar7->hole == 0) {
        archive_entry_sparse_add_entry(entry,psVar7->offset,psVar7->remaining);
      }
      psVar7 = psVar7->next;
    } while (psVar7 != (sparse_block *)0x0);
  }
  if (wVar1 == L'\0') {
    mVar2 = archive_entry_filetype(entry);
    wVar1 = L'\0';
    if (mVar2 == 0x8000) {
      __s = archive_entry_pathname_w(entry);
      if (__s == (wchar_t *)0x0) {
        __s_00 = archive_entry_pathname(entry);
        if (__s_00 == (char *)0x0) {
          return L'\0';
        }
        sVar5 = strlen(__s_00);
        if (sVar5 == 0) {
          return L'\0';
        }
        if (__s_00[sVar5 - 1] != '/') {
          return L'\0';
        }
      }
      else {
        sVar5 = wcslen(__s);
        if (sVar5 == 0) {
          return L'\0';
        }
        if (__s[sVar5 - 1] != L'/') {
          return L'\0';
        }
      }
      archive_entry_set_filetype(entry,0x4000);
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_tar_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	/*
	 * When converting tar archives to cpio archives, it is
	 * essential that each distinct file have a distinct inode
	 * number.  To simplify this, we keep a static count here to
	 * assign fake dev/inode numbers to each tar entry.  Note that
	 * pax format archives may overwrite this with something more
	 * useful.
	 *
	 * Ideally, we would track every file read from the archive so
	 * that we could assign the same dev/ino pair to hardlinks,
	 * but the memory required to store a complete lookup table is
	 * probably not worthwhile just to support the relatively
	 * obscure tar->cpio conversion case.
	 */
	static int default_inode;
	static int default_dev;
	struct tar *tar;
	const char *p;
	const wchar_t *wp;
	int r;
	size_t l, unconsumed = 0;

	/* Assign default device/inode values. */
	archive_entry_set_dev(entry, 1 + default_dev); /* Don't use zero. */
	archive_entry_set_ino(entry, ++default_inode); /* Don't use zero. */
	/* Limit generated st_ino number to 16 bits. */
	if (default_inode >= 0xffff) {
		++default_dev;
		default_inode = 0;
	}

	tar = (struct tar *)(a->format->data);
	tar->entry_offset = 0;
	gnu_clear_sparse_list(tar);
	tar->realsize = -1; /* Mark this as "unset" */

	/* Setup default string conversion. */
	tar->sconv = tar->opt_sconv;
	if (tar->sconv == NULL) {
		if (!tar->init_default_conversion) {
			tar->sconv_default =
			    archive_string_default_conversion_for_read(&(a->archive));
			tar->init_default_conversion = 1;
		}
		tar->sconv = tar->sconv_default;
	}

	r = tar_read_header(a, tar, entry, &unconsumed);

	tar_flush_unconsumed(a, &unconsumed);

	/*
	 * "non-sparse" files are really just sparse files with
	 * a single block.
	 */
	if (tar->sparse_list == NULL) {
		if (gnu_add_sparse_entry(a, tar, 0, tar->entry_bytes_remaining)
		    != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		struct sparse_block *sb;

		for (sb = tar->sparse_list; sb != NULL; sb = sb->next) {
			if (!sb->hole)
				archive_entry_sparse_add_entry(entry,
				    sb->offset, sb->remaining);
		}
	}

	if (r == ARCHIVE_OK && archive_entry_filetype(entry) == AE_IFREG) {
		/*
		 * "Regular" entry with trailing '/' is really
		 * directory: This is needed for certain old tar
		 * variants and even for some broken newer ones.
		 */
		if ((wp = archive_entry_pathname_w(entry)) != NULL) {
			l = wcslen(wp);
			if (l > 0 && wp[l - 1] == L'/') {
				archive_entry_set_filetype(entry, AE_IFDIR);
			}
		} else if ((p = archive_entry_pathname(entry)) != NULL) {
			l = strlen(p);
			if (l > 0 && p[l - 1] == '/') {
				archive_entry_set_filetype(entry, AE_IFDIR);
			}
		}
	}
	return (r);
}